

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
iterate(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        *this)

{
  allocator<unsigned_char> *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deInt32 dVar5;
  deInt32 numBytes;
  uint uVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  const_reference pvVar9;
  void *dst;
  reference pvVar10;
  reference pvVar11;
  bool sampleRunSuccessful;
  int sampleNdx;
  int currentIteration;
  int randomBufferNdx_5;
  void *ptr;
  deUint32 usage_2;
  int randomSize_2;
  int randomBufferNdx_4;
  deUint32 bufferIDs_2 [3];
  int randomBufferNdx_3;
  deUint32 usage_1;
  int randomSize_1;
  int randomBufferNdx_2;
  deUint32 bufferIDs_1 [3];
  Random rnd_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zeroData_1;
  int maxBufferSize_1;
  int numRandomBuffers_1;
  int randomBufferNdx_1;
  deUint32 usage;
  int randomSize;
  int randomBufferNdx;
  int ndx;
  deUint32 bufferIDs [6];
  Random rnd;
  allocator<unsigned_char> local_4a;
  value_type_conflict5 local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zeroData;
  int maxBufferSize;
  int numRepeats;
  int numRandomBuffers;
  Functions *gl;
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  *this_local;
  long lVar8;
  
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  if (((this->m_useGL & 1U) == 0) || ((iterate::buffersWarmedUp & 1U) != 0)) {
    if (((this->m_useGL & 1U) == 0) ||
       (iVar3 = this->m_bufferRandomizerTimer, this->m_bufferRandomizerTimer = iVar3 + 1,
       iVar3 % 8 != 0)) {
      uVar6 = this->m_iteration;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->m_iterationOrder,(long)(int)uVar6);
      pvVar11 = std::
                vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                ::operator[](&this->m_results,(long)*pvVar10);
      uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,(ulong)uVar6,pvVar11);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"post runSample()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x85b);
      if ((uVar6 & 1) == 0) {
        this_local._4_4_ = CONTINUE;
      }
      else {
        iVar3 = this->m_iteration + 1;
        this->m_iteration = iVar3;
        if (iVar3 < this->m_numSamples) {
          this_local._4_4_ = CONTINUE;
        }
        else {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                    (this,&this->m_results);
          this_local._4_4_ = STOP;
        }
      }
    }
    else {
      rnd_1.m_rnd.z._3_1_ = 0;
      this_00 = (allocator<unsigned_char> *)((long)&rnd_1.m_rnd.z + 2);
      std::allocator<unsigned_char>::allocator(this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd_1.m_rnd.w,0x1000000,
                 (value_type_conflict5 *)((long)&rnd_1.m_rnd.z + 3),this_00);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)((long)&rnd_1.m_rnd.z + 2));
      de::Random::Random((Random *)(bufferIDs_1 + 1),this->m_bufferRandomizerTimer * 0xabc + 0x1234)
      ;
      memset(&randomSize_1,0,0xc);
      for (usage_1 = 0; (int)usage_1 < 3; usage_1 = usage_1 + 1) {
        iVar3 = de::Random::getInt((Random *)(bufferIDs_1 + 1),1,0x1000000);
        dVar5 = deAlign32(iVar3,0x10);
        dVar4 = de::Random::getUint32((Random *)(bufferIDs_1 + 1));
        bufferIDs_2[2] = iterate::usages[dVar4 % 9];
        (**(code **)(lVar8 + 0x6c8))(1,&randomSize_1 + (int)usage_1);
        (**(code **)(lVar8 + 0x40))(0x8892,(&randomSize_1)[(int)usage_1]);
        pcVar1 = *(code **)(lVar8 + 0x150);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd_1.m_rnd.w,
                            0);
        (*pcVar1)(0x8892,(long)dVar5,pvVar9,bufferIDs_2[2]);
      }
      for (bufferIDs_2[1] = 0; (int)bufferIDs_2[1] < 3; bufferIDs_2[1] = bufferIDs_2[1] + 1) {
        (**(code **)(lVar8 + 0x438))(1,&randomSize_1 + (int)bufferIDs_2[1]);
      }
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"buffer ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x82d);
      memset(&randomSize_2,0,0xc);
      for (usage_2 = 0; (int)usage_2 < 3; usage_2 = usage_2 + 1) {
        iVar3 = de::Random::getInt((Random *)(bufferIDs_1 + 1),1,0x1000000);
        numBytes = deAlign32(iVar3,0x10);
        dVar4 = de::Random::getUint32((Random *)(bufferIDs_1 + 1));
        dVar4 = iterate::usages[dVar4 % 9];
        (**(code **)(lVar8 + 0x6c8))(1,&randomSize_2 + (int)usage_2);
        (**(code **)(lVar8 + 0x40))(0x8892,(&randomSize_2)[(int)usage_2]);
        pcVar1 = *(code **)(lVar8 + 0x150);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd_1.m_rnd.w,
                            0);
        (*pcVar1)(0x8892,(long)numBytes,pvVar9,dVar4);
        (**(code **)(lVar8 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
        (**(code **)(lVar8 + 0x538))(0,0,1);
        dVar5 = numBytes;
        if (numBytes < 0) {
          dVar5 = numBytes + 0xf;
        }
        (**(code **)(lVar8 + 0x538))(0,(dVar5 >> 4) + -1,1);
        bVar2 = de::Random::getBool((Random *)(bufferIDs_1 + 1));
        if (bVar2) {
          waitGLResults(this);
        }
        dst = (void *)(**(code **)(lVar8 + 0xd00))(0x8892,0,(long)numBytes,2);
        if (dst != (void *)0x0) {
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &rnd_1.m_rnd.w,0);
          medianTimeMemcpy(dst,pvVar9,numBytes);
          (**(code **)(lVar8 + 0x1670))(0x8892);
        }
      }
      for (sampleNdx = 0; sampleNdx < 3; sampleNdx = sampleNdx + 1) {
        (**(code **)(lVar8 + 0x438))(1,&randomSize_2 + sampleNdx);
      }
      waitGLResults(this);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"buffer maps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x852);
      this_local._4_4_ = CONTINUE;
      de::Random::~Random((Random *)(bufferIDs_1 + 1));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd_1.m_rnd.w);
    }
  }
  else {
    zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1000000;
    local_49 = '\0';
    std::allocator<unsigned_char>::allocator(&local_4a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x1000000,&local_49
               ,&local_4a);
    std::allocator<unsigned_char>::~allocator(&local_4a);
    de::Random::Random((Random *)(bufferIDs + 5),0x1234);
    _randomBufferNdx = 0;
    bufferIDs[0] = 0;
    bufferIDs[1] = 0;
    bufferIDs[2] = 0;
    bufferIDs[3] = 0;
    pcVar1 = *(code **)(lVar8 + 0x1680);
    dVar4 = glu::ShaderProgram::getProgram(this->m_dummyProgram);
    (*pcVar1)(dVar4);
    (**(code **)(lVar8 + 0x1a00))(0,0,0x20);
    (**(code **)(lVar8 + 0x610))(this->m_dummyProgramPosLoc);
    for (randomSize = 0; randomSize < 10; randomSize = randomSize + 1) {
      for (usage = 0; (int)usage < 6; usage = usage + 1) {
        iVar3 = de::Random::getInt((Random *)(bufferIDs + 5),1,0x1000000);
        dVar5 = deAlign32(iVar3,0x10);
        dVar4 = de::Random::getUint32((Random *)(bufferIDs + 5));
        dVar4 = iterate::usages[dVar4 % 9];
        (**(code **)(lVar8 + 0x6c8))(1,&randomBufferNdx + (int)usage);
        (**(code **)(lVar8 + 0x40))(0x8892,(&randomBufferNdx)[(int)usage]);
        pcVar1 = *(code **)(lVar8 + 0x150);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
        (*pcVar1)(0x8892,(long)dVar5,pvVar9,dVar4);
        bVar2 = de::Random::getBool((Random *)(bufferIDs + 5));
        if (bVar2) {
          (**(code **)(lVar8 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
          (**(code **)(lVar8 + 0x538))(0,0,1);
          if (dVar5 < 0) {
            dVar5 = dVar5 + 0xf;
          }
          (**(code **)(lVar8 + 0x538))(0,(dVar5 >> 4) + -1,1);
        }
      }
      for (maxBufferSize_1 = 0; maxBufferSize_1 < 6; maxBufferSize_1 = maxBufferSize_1 + 1) {
        (**(code **)(lVar8 + 0x438))(1,&randomBufferNdx + maxBufferSize_1);
      }
      waitGLResults(this);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"Buffer gen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x808);
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    }
    iterate::buffersWarmedUp = true;
    this_local._4_4_ = CONTINUE;
    de::Random::~Random((Random *)(bufferIDs + 5));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult BasicBufferCase<SampleType>::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	static bool				buffersWarmedUp	= false;

	static const deUint32	usages[] =
	{
		GL_STREAM_DRAW, GL_STREAM_READ, GL_STREAM_COPY,
		GL_STATIC_DRAW, GL_STATIC_READ, GL_STATIC_COPY,
		GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
	};

	// Allocate some random sized buffers and remove them to
	// make sure the first samples too have some buffers removed
	// just before their allocation. This is only needed by the
	// the first test.

	if (m_useGL && !buffersWarmedUp)
	{
		const int					numRandomBuffers				= 6;
		const int					numRepeats						= 10;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234);
		deUint32					bufferIDs[numRandomBuffers]		= {0};

		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);

		for (int ndx = 0; ndx < numRepeats; ++ndx)
		{
			// Create buffer and maybe draw from it
			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				if (rnd.getBool())
				{
					gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
					gl.drawArrays(GL_POINTS, 0, 1);
					gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer gen");

			m_testCtx.touchWatchdog();
		}

		buffersWarmedUp = true;
		return CONTINUE;
	}
	else if (m_useGL && m_bufferRandomizerTimer++ % 8 == 0)
	{
		// Do some random buffer operations to every now and then
		// to make sure the previous test iterations won't affect
		// following test runs.

		const int					numRandomBuffers				= 3;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234 + 0xabc * m_bufferRandomizerTimer);

		// BufferData
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer ops");

		// Do some memory mappings
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];
				void*			ptr;

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
				gl.drawArrays(GL_POINTS, 0, 1);
				gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);

				if (rnd.getBool())
					waitGLResults();

				ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, randomSize, GL_MAP_WRITE_BIT);
				if (ptr)
				{
					medianTimeMemcpy(ptr, &zeroData[0], randomSize);
					gl.unmapBuffer(GL_ARRAY_BUFFER);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer maps");
		return CONTINUE;
	}
	else
	{
		const int	currentIteration	= m_iteration;
		const int	sampleNdx			= m_iterationOrder[currentIteration];
		const bool	sampleRunSuccessful	= runSample(currentIteration, m_results[sampleNdx]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "post runSample()");

		// Retry failed samples
		if (!sampleRunSuccessful)
			return CONTINUE;

		if (++m_iteration >= m_numSamples)
		{
			logAndSetTestResult(m_results);
			return STOP;
		}
		else
			return CONTINUE;
	}
}